

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

uint8 * rw::getFileContents(char *name,uint32 *len)

{
  FILE *__stream;
  long lVar1;
  uint8 *__ptr;
  
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = (uint8 *)0x0;
  }
  else {
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    *len = (uint32)lVar1;
    fseek(__stream,0,0);
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/base.cpp line: 1115"
    ;
    __ptr = (uint8 *)(*DAT_00145dd8)(*len,0x30000);
    fread(__ptr,1,(ulong)*len,__stream);
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

uint8*
getFileContents(const char *name, uint32 *len)
{
	FILE *cf = fopen(name, "rb");
	if(cf == nil)
		return nil;
	fseek(cf, 0, SEEK_END);
	*len = ftell(cf);
	fseek(cf, 0, SEEK_SET);
	uint8 *data = rwNewT(uint8, *len, MEMDUR_EVENT);
	fread(data, 1, *len, cf);
	fclose(cf);
	return data;
}